

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_3dPoint> *a)

{
  ON_3dPoint *p;
  undefined1 local_1d;
  undefined4 local_1c;
  bool rc;
  int count;
  ON_SimpleArray<ON_3dPoint> *a_local;
  ON_BinaryArchive *this_local;
  
  local_1c = ON_SimpleArray<ON_3dPoint>::Count(a);
  if (local_1c < 0) {
    local_1c = 0;
  }
  local_1d = WriteInt(this,local_1c);
  if ((local_1d) && (0 < local_1c)) {
    p = ON_SimpleArray<ON_3dPoint>::Array(a);
    local_1d = WriteDouble(this,(long)(local_1c * 3),&p->x);
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_3dPoint>& a )
{
  int count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  if ( rc && count > 0 ) {
    rc = WriteDouble( count*3, &a.Array()->x );
  }
  return rc;
}